

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetMessageFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          Descriptor *desc)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  ulong uVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  string local_68;
  string local_48;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,*(long *)this,*(long *)(this + 8) + *(long *)this);
  std::__cxx11::string::append((char *)&local_88);
  anon_unknown_0::ToFileName(&local_48,(string *)(options->output_dir)._M_dataplus._M_p);
  uVar5 = 0xf;
  if (local_88 != local_78) {
    uVar5 = local_78[0];
  }
  if (uVar5 < local_48._M_string_length + local_80) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      uVar6 = local_48.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_48._M_string_length + local_80) goto LAB_00229ee2;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_00229ee2:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48._M_dataplus._M_p);
  }
  local_a8 = &local_98;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (ulong *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_68,(GeneratorOptions *)this);
  uVar5 = 0xf;
  if (local_a8 != &local_98) {
    uVar5 = local_98;
  }
  if (uVar5 < local_68._M_string_length + local_a0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_a0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00229faf;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
LAB_00229faf:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar2) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  psVar4 = (string *)&local_48.field_2;
  if ((string *)local_48._M_dataplus._M_p != psVar4) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    psVar4 = extraout_RAX;
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

string GetMessageFileName(const GeneratorOptions& options,
                          const Descriptor* desc) {
  return options.output_dir + "/" + ToFileName(desc->name()) +
         options.GetFileNameExtension();
}